

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void * cimg_library::CImgDisplay::_events_thread(void *param_1)

{
  Window WVar1;
  int iVar2;
  X11_info *pXVar3;
  bool bVar4;
  uint i;
  bool event_flag;
  XEvent event;
  Display *dpy;
  uint local_d8;
  undefined1 local_d0 [32];
  Window local_b0;
  Display *local_10;
  
  pXVar3 = cimg::X11_attr();
  local_10 = pXVar3->display;
  pthread_setcanceltype(0,(int *)0x0);
  pthread_setcancelstate(0,(int *)0x0);
  do {
    XLockDisplay(local_10);
    iVar2 = XCheckTypedEvent(local_10,0x21,local_d0);
    bVar4 = iVar2 != 0;
    if (!bVar4) {
      iVar2 = XCheckMaskEvent(local_10,0x2807f,local_d0);
      bVar4 = iVar2 != 0;
    }
    if (bVar4) {
      for (local_d8 = 0; pXVar3 = cimg::X11_attr(), local_d8 < pXVar3->nb_wins;
          local_d8 = local_d8 + 1) {
        pXVar3 = cimg::X11_attr();
        WVar1 = local_b0;
        if (((pXVar3->wins[local_d8]->_is_closed & 1U) == 0) &&
           (pXVar3 = cimg::X11_attr(), WVar1 == pXVar3->wins[local_d8]->_window)) {
          cimg::X11_attr();
          _handle_events((CImgDisplay *)param_1,(XEvent *)dpy);
        }
      }
    }
    XUnlockDisplay(local_10);
    pthread_testcancel();
    cimg::sleep(8);
  } while( true );
}

Assistant:

static void* _events_thread(void *) { // Only one thread to handle events for all opened display windows.
      Display *const dpy = cimg::X11_attr().display;
      XEvent event;
      pthread_setcanceltype(PTHREAD_CANCEL_DEFERRED,0);
      pthread_setcancelstate(PTHREAD_CANCEL_ENABLE,0);
      for (;;) {
        XLockDisplay(dpy);
        bool event_flag = XCheckTypedEvent(dpy,ClientMessage,&event);
        if (!event_flag) event_flag = XCheckMaskEvent(dpy,
                                                      ExposureMask | StructureNotifyMask | ButtonPressMask|
                                                      KeyPressMask | PointerMotionMask | EnterWindowMask | LeaveWindowMask|
                                                      ButtonReleaseMask | KeyReleaseMask,&event);
        if (event_flag)
          for (unsigned int i = 0; i<cimg::X11_attr().nb_wins; ++i)
            if (!cimg::X11_attr().wins[i]->_is_closed && event.xany.window==cimg::X11_attr().wins[i]->_window)
              cimg::X11_attr().wins[i]->_handle_events(&event);
        XUnlockDisplay(dpy);
        pthread_testcancel();
        cimg::sleep(8);
      }
      return 0;
    }